

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void ARGBUnattenuateRow_AVX2(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  undefined1 auVar1 [32];
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  lVar10 = (long)dst_argb - (long)src_argb;
  auVar12._16_16_ = (undefined1  [16])libyuv::kUnattenShuffleAlpha_AVX2;
  auVar12._0_16_ = (undefined1  [16])libyuv::kUnattenShuffleAlpha_AVX2;
  do {
    auVar3 = vpunpckldq_avx(ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [32])src_argb)[3]]),
                            ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [32])src_argb)[7]]));
    auVar4 = vpunpckldq_avx(ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [32])src_argb)[0xb]]),
                            ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [32])src_argb)[0xf]]));
    auVar5 = vpunpckldq_avx(ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [32])src_argb)[0x13]]),
                            ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [32])src_argb)[0x17]]));
    auVar6 = vpunpckldq_avx(ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [32])src_argb)[0x1b]]),
                            ZEXT416(fixed_invtbl8[(byte)(*(undefined1 (*) [32])src_argb)[0x1f]]));
    auVar3 = vpunpcklqdq_avx(auVar3,auVar4);
    auVar4 = vpunpcklqdq_avx(auVar5,auVar6);
    auVar11._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar3;
    auVar11._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
    auVar1 = *(undefined1 (*) [32])src_argb;
    auVar8 = vpunpcklbw_avx2(auVar1,auVar1);
    auVar7 = vpunpckhbw_avx2(auVar1,auVar1);
    auVar1 = vpunpcklwd_avx2(auVar11,auVar11);
    auVar11 = vpunpckhwd_avx2(auVar11,auVar11);
    auVar1 = vpshufb_avx2(auVar1,auVar12);
    auVar11 = vpshufb_avx2(auVar11,auVar12);
    auVar1 = vpmulhuw_avx2(auVar8,auVar1);
    auVar11 = vpmulhuw_avx2(auVar7,auVar11);
    auVar1 = vpackuswb_avx2(auVar1,auVar11);
    *(undefined1 (*) [32])((long)src_argb + lVar10) = auVar1;
    src_argb = (uint8_t *)((long)src_argb + 0x20);
    iVar9 = width + -8;
    bVar2 = 7 < width;
    width = iVar9;
  } while (iVar9 != 0 && bVar2);
  return;
}

Assistant:

void ARGBUnattenuateRow_AVX2(const uint8_t* src_argb,
                             uint8_t* dst_argb,
                             int width) {
  uintptr_t alpha;
  asm volatile(
      "sub         %0,%1                         \n"
      "vbroadcastf128 %5,%%ymm5                  \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      // replace VPGATHER
      "movzb       0x03(%0),%3                   \n"
      "vmovd       0x00(%4,%3,4),%%xmm0          \n"
      "movzb       0x07(%0),%3                   \n"
      "vmovd       0x00(%4,%3,4),%%xmm1          \n"
      "movzb       0x0b(%0),%3                   \n"
      "vpunpckldq  %%xmm1,%%xmm0,%%xmm6          \n"
      "vmovd       0x00(%4,%3,4),%%xmm2          \n"
      "movzb       0x0f(%0),%3                   \n"
      "vmovd       0x00(%4,%3,4),%%xmm3          \n"
      "movzb       0x13(%0),%3                   \n"
      "vpunpckldq  %%xmm3,%%xmm2,%%xmm7          \n"
      "vmovd       0x00(%4,%3,4),%%xmm0          \n"
      "movzb       0x17(%0),%3                   \n"
      "vmovd       0x00(%4,%3,4),%%xmm1          \n"
      "movzb       0x1b(%0),%3                   \n"
      "vpunpckldq  %%xmm1,%%xmm0,%%xmm0          \n"
      "vmovd       0x00(%4,%3,4),%%xmm2          \n"
      "movzb       0x1f(%0),%3                   \n"
      "vmovd       0x00(%4,%3,4),%%xmm3          \n"
      "vpunpckldq  %%xmm3,%%xmm2,%%xmm2          \n"
      "vpunpcklqdq %%xmm7,%%xmm6,%%xmm3          \n"
      "vpunpcklqdq %%xmm2,%%xmm0,%%xmm0          \n"
      "vinserti128 $0x1,%%xmm0,%%ymm3,%%ymm3     \n"
      // end of VPGATHER

      "vmovdqu     (%0),%%ymm6                   \n"
      "vpunpcklbw  %%ymm6,%%ymm6,%%ymm0          \n"
      "vpunpckhbw  %%ymm6,%%ymm6,%%ymm1          \n"
      "vpunpcklwd  %%ymm3,%%ymm3,%%ymm2          \n"
      "vpunpckhwd  %%ymm3,%%ymm3,%%ymm3          \n"
      "vpshufb     %%ymm5,%%ymm2,%%ymm2          \n"
      "vpshufb     %%ymm5,%%ymm3,%%ymm3          \n"
      "vpmulhuw    %%ymm2,%%ymm0,%%ymm0          \n"
      "vpmulhuw    %%ymm3,%%ymm1,%%ymm1          \n"
      "vpackuswb   %%ymm1,%%ymm0,%%ymm0          \n"
      "vmovdqu     %%ymm0,0x00(%0,%1,1)          \n"
      "lea         0x20(%0),%0                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_argb),                 // %0
        "+r"(dst_argb),                 // %1
        "+r"(width),                    // %2
        "=&r"(alpha)                    // %3
      : "r"(fixed_invtbl8),             // %4
        "m"(kUnattenShuffleAlpha_AVX2)  // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}